

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O1

bool NES_APU_np_Write(void *chip,UINT16 adr,UINT8 val)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  NES_APU *apu;
  UINT8 *pUVar8;
  uint uVar9;
  int iVar10;
  
  uVar7 = (uint)CONCAT62(in_register_00000032,adr);
  if ((uVar7 & 0xfffffff8) == 0x4000) {
    uVar7 = uVar7 & 7;
    uVar2 = (ulong)(uVar7 >> 2);
    uVar6 = (ushort)uVar7;
    switch(uVar7) {
    default:
      *(uint *)((long)chip + uVar2 * 4 + 0xf8) = val & 0xf;
      *(byte *)((long)chip + uVar2 + 0x130) = val >> 4 & 1;
      *(byte *)((long)chip + uVar2 + 0x132) = val >> 5 & 1;
      *(uint *)((long)chip + uVar2 * 4 + 0x138) = val & 0xf;
      uVar9 = (uint)(val >> 6);
      *(uint *)((long)chip + uVar2 * 4 + 0xf0) = uVar9;
      if (*(int *)((long)chip + 0x14) != 0) {
        if (uVar9 == 2) {
          *(undefined4 *)((long)chip + uVar2 * 4 + 0xf0) = 1;
        }
        else if (uVar9 == 1) {
          *(undefined4 *)((long)chip + uVar2 * 4 + 0xf0) = 2;
        }
      }
      break;
    case 1:
    case 5:
      *(UINT8 *)((long)chip + uVar2 + 0x110) = val >> 7;
      *(uint *)((long)chip + uVar2 * 4 + 0x118) = val >> 4 & 7;
      *(byte *)((long)chip + uVar2 + 0x112) = val >> 3 & 1;
      *(uint *)((long)chip + uVar2 * 4 + 0x128) = val & 7;
      *(undefined1 *)((long)chip + uVar2 + 0x114) = 1;
      iVar1 = *(int *)((long)chip + uVar2 * 4 + 0x100);
      iVar10 = iVar1 >> (*(byte *)((long)chip + uVar2 * 4 + 0x128) & 0x1f);
      if (uVar6 < 4) {
        iVar10 = (iVar10 + 1) - (uint)(*(char *)((long)chip + uVar2 + 0x112) == '\0');
      }
      iVar4 = -iVar10;
      if (*(char *)((long)chip + uVar2 + 0x112) == '\0') {
        iVar4 = iVar10;
      }
      *(int *)((long)chip + uVar2 * 4 + 0x108) = iVar4 + iVar1;
      break;
    case 2:
    case 6:
      uVar9 = *(uint *)((long)chip + uVar2 * 4 + 0x100) & 0x700 | (uint)val;
      *(uint *)((long)chip + uVar2 * 4 + 0x100) = uVar9;
      uVar5 = (ulong)((uVar7 >> 2) * 4);
      iVar1 = *(int *)((long)chip + uVar5 + 0x100);
      iVar10 = iVar1 >> (*(byte *)((long)chip + uVar5 + 0x128) & 0x1f);
      if (uVar6 < 4) {
        iVar10 = (iVar10 + 1) - (uint)(*(char *)((long)chip + uVar2 + 0x112) == '\0');
      }
      iVar4 = -iVar10;
      if (*(char *)((long)chip + uVar2 + 0x112) == '\0') {
        iVar4 = iVar10;
      }
      *(int *)((long)chip + uVar2 * 4 + 0x108) = iVar4 + iVar1;
      if ((int)uVar9 < *(int *)((long)chip + uVar2 * 4 + 0xe0)) {
        *(uint *)((long)chip + uVar2 * 4 + 0xe0) = uVar9;
      }
      break;
    case 3:
    case 7:
      *(uint *)((long)chip + uVar2 * 4 + 0x100) =
           (val & 7) << 8 | (uint)*(byte *)((long)chip + uVar2 * 4 + 0x100);
      if (*(int *)((long)chip + 0x10) != 0) {
        *(undefined4 *)((long)chip + uVar2 * 4 + 0xe8) = 0;
      }
      *(undefined1 *)((long)chip + uVar2 + 0x134) = 1;
      if (*(char *)((long)chip + uVar2 + 0x158) != '\0') {
        *(uint *)((long)chip + uVar2 * 4 + 0x150) = (uint)NES_APU_np_Write::length_table[val >> 3];
      }
      iVar1 = *(int *)((long)chip + uVar2 * 4 + 0x100);
      iVar10 = iVar1 >> (*(byte *)((long)chip + uVar2 * 4 + 0x128) & 0x1f);
      if (uVar6 < 4) {
        iVar10 = (iVar10 + 1) - (uint)(*(char *)((long)chip + uVar2 + 0x112) == '\0');
      }
      iVar4 = -iVar10;
      if (*(char *)((long)chip + uVar2 + 0x112) == '\0') {
        iVar4 = iVar10;
      }
      *(int *)((long)chip + uVar2 * 4 + 0x108) = iVar4 + iVar1;
      iVar1 = *(int *)((long)chip + uVar2 * 4 + 0x100);
      if (iVar1 < *(int *)((long)chip + uVar2 * 4 + 0xe0)) {
        *(int *)((long)chip + uVar2 * 4 + 0xe0) = iVar1;
      }
    }
    pUVar8 = (UINT8 *)((long)chip + (ulong)uVar7 + 0x30);
  }
  else {
    if (adr != 0x4015) {
      return false;
    }
    *(byte *)((long)chip + 0x158) = val & 1;
    bVar3 = val >> 1 & 1;
    *(byte *)((long)chip + 0x159) = bVar3;
    if ((val & 1) == 0) {
      *(undefined4 *)((long)chip + 0x150) = 0;
    }
    if (bVar3 == 0) {
      *(undefined4 *)((long)chip + 0x154) = 0;
    }
    pUVar8 = (UINT8 *)((long)chip + 0x45);
  }
  *pUVar8 = val;
  return true;
}

Assistant:

bool NES_APU_np_Write(void* chip, UINT16 adr, UINT8 val)
{
	NES_APU* apu = (NES_APU*)chip;
	int ch;

	static const UINT8 length_table[32] = {
		0x0A, 0xFE,
		0x14, 0x02,
		0x28, 0x04,
		0x50, 0x06,
		0xA0, 0x08,
		0x3C, 0x0A,
		0x0E, 0x0C,
		0x1A, 0x0E,
		0x0C, 0x10,
		0x18, 0x12,
		0x30, 0x14,
		0x60, 0x16,
		0xC0, 0x18,
		0x48, 0x1A,
		0x10, 0x1C,
		0x20, 0x1E
	};

	if (0x4000 <= adr && adr < 0x4008)
	{
		//DEBUG_OUT("$%04X = %02X\n",adr,val);

		adr &= 0xf;
		ch = adr >> 2;
		switch (adr)
		{
		case 0x0:
		case 0x4:
			apu->volume[ch] = val & 15;
			apu->envelope_disable[ch] = (val >> 4) & 1;
			apu->envelope_loop[ch] = (val >> 5) & 1;
			apu->envelope_div_period[ch] = (val & 15);
			apu->duty[ch] = (val >> 6) & 3;
			if (apu->option[OPT_DUTY_SWAP])
			{
				if      (apu->duty[ch] == 1) apu->duty[ch] = 2;
				else if (apu->duty[ch] == 2) apu->duty[ch] = 1;
			}
			break;

		case 0x1:
		case 0x5:
			apu->sweep_enable[ch] = (val >> 7) & 1;
			apu->sweep_div_period[ch] = (((val >> 4) & 7));
			apu->sweep_mode[ch] = (val >> 3) & 1;
			apu->sweep_amount[ch] = val & 7;
			apu->sweep_write[ch] = true;
			sweep_sqr(apu, ch);
			break;

		case 0x2:
		case 0x6:
			apu->freq[ch] = val | (apu->freq[ch] & 0x700) ;
			sweep_sqr(apu, ch);
			if (apu->scounter[ch] > apu->freq[ch]) apu->scounter[ch] = apu->freq[ch];
			break;

		case 0x3:
		case 0x7:
			apu->freq[ch] = (apu->freq[ch] & 0xFF) | ((val & 0x7) << 8) ;

			if (apu->option[OPT_PHASE_REFRESH])
				apu->sphase[ch] = 0;
			apu->envelope_write[ch] = true;
			if (apu->enable[ch])
			{
				apu->length_counter[ch] = length_table[(val >> 3) & 0x1f];
			}
			sweep_sqr(apu, ch);
			if (apu->scounter[ch] > apu->freq[ch]) apu->scounter[ch] = apu->freq[ch];
			break;

		default:
			return false;
		}
		apu->reg[adr] = val;
		return true;
	}
	else if (adr == 0x4015)
	{
		apu->enable[0] = (val & 1) ? true : false;
		apu->enable[1] = (val & 2) ? true : false;

		if (!apu->enable[0])
			apu->length_counter[0] = 0;
		if (!apu->enable[1])
			apu->length_counter[1] = 0;

		apu->reg[adr-0x4000] = val;
		return true;
	}

	// 4017 is handled in np_nes_dmc.c
	//else if (adr == 0x4017)
	//{
	//}

	return false;
}